

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

bool __thiscall t_cpp_generator::is_complex_type(t_cpp_generator *this,t_type *ttype)

{
  uint uVar1;
  t_base tVar2;
  t_base_type *this_00;
  bool local_1a;
  bool local_19;
  t_type *ttype_local;
  t_cpp_generator *this_local;
  
  this_00 = (t_base_type *)t_generator::get_true_type(ttype);
  uVar1 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xd])();
  local_19 = true;
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xb])();
    local_19 = true;
    if ((uVar1 & 1) == 0) {
      uVar1 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xc])();
      local_19 = true;
      if ((uVar1 & 1) == 0) {
        uVar1 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[5])();
        local_1a = false;
        if ((uVar1 & 1) != 0) {
          tVar2 = t_base_type::get_base(this_00);
          local_1a = tVar2 == TYPE_STRING;
        }
        local_19 = local_1a;
      }
    }
  }
  return local_19;
}

Assistant:

bool is_complex_type(t_type* ttype) {
    ttype = get_true_type(ttype);

    return ttype->is_container() || ttype->is_struct() || ttype->is_xception()
           || (ttype->is_base_type()
               && (((t_base_type*)ttype)->get_base() == t_base_type::TYPE_STRING));
  }